

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O1

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC,int *stage_map,int *nstages_active)

{
  sunrealtype ***pppsVar1;
  sunrealtype ***pppsVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  
  iVar3 = -0x16;
  if ((MRIC != (MRIStepCoupling)0x0) &&
     (((pppsVar1 = MRIC->W, pppsVar1 != (sunrealtype ***)0x0 || (MRIC->G != (sunrealtype ***)0x0))
      && (nstages_active != (int *)0x0 && stage_map != (int *)0x0)))) {
    if (1 < MRIC->type - MRISTEP_MERK) {
      *nstages_active = 0;
      uVar9 = (ulong)(uint)MRIC->stages;
      if (MRIC->stages < 1) {
        iVar5 = 0;
      }
      else {
        pppsVar2 = MRIC->G;
        lVar4 = 0;
        iVar5 = 0;
        do {
          iVar8 = (int)uVar9;
          if ((pppsVar1 == (sunrealtype ***)0x0) || ((long)MRIC->nmat < 1)) {
            bVar6 = false;
          }
          else {
            dVar11 = 0.0;
            lVar10 = 0;
            do {
              if (-1 < iVar8) {
                uVar9 = 0;
                do {
                  dVar11 = dVar11 + ABS(pppsVar1[lVar10][uVar9][lVar4]);
                  uVar9 = uVar9 + 1;
                } while (iVar8 + 1 != uVar9);
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 != MRIC->nmat);
            bVar6 = 2.220446049250313e-14 < dVar11;
          }
          if ((pppsVar2 == (sunrealtype ***)0x0) || ((long)MRIC->nmat < 1)) {
            bVar7 = false;
          }
          else {
            dVar11 = 0.0;
            lVar10 = 0;
            do {
              if (-1 < iVar8) {
                uVar9 = 0;
                do {
                  dVar11 = dVar11 + ABS(pppsVar2[lVar10][uVar9][lVar4]);
                  uVar9 = uVar9 + 1;
                } while (iVar8 + 1 != uVar9);
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 != MRIC->nmat);
            bVar7 = 2.220446049250313e-14 < dVar11;
          }
          if ((bool)(bVar6 | bVar7)) {
            stage_map[lVar4] = iVar5;
            iVar5 = iVar5 + 1;
          }
          else {
            stage_map[lVar4] = -1;
          }
          lVar4 = lVar4 + 1;
          uVar9 = (ulong)MRIC->stages;
        } while (lVar4 < (long)uVar9);
      }
      if (0 < iVar5) {
        *nstages_active = iVar5;
        iVar3 = 0;
      }
      return iVar3;
    }
    *nstages_active = MRIC->stages;
    if (MRIC->stages < 1) {
      return 0;
    }
    iVar3 = 0;
    lVar4 = 0;
    do {
      stage_map[lVar4] = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 < MRIC->stages);
  }
  return iVar3;
}

Assistant:

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC, int* stage_map,
                                int* nstages_active)
{
  int i, j, k, idx;
  sunrealtype Wsum, Gsum;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* ----------------------
   * Check for valid inputs
   * ---------------------- */

  if (!MRIC) { return (ARK_ILL_INPUT); }
  if (!(MRIC->W) && !(MRIC->G)) { return (ARK_ILL_INPUT); }
  if (!stage_map || !nstages_active) { return (ARK_ILL_INPUT); }

  /* -------------------------------------------
   * MERK and MRI-SR have "identity" storage map
   * ------------------------------------------- */

  if ((MRIC->type == MRISTEP_MERK) || (MRIC->type == MRISTEP_SR))
  {
    /* Number of stage RHS vectors active */
    *nstages_active = MRIC->stages;

    /* Create an identity map (all columns are non-zero) */
    for (j = 0; j < MRIC->stages; j++) { stage_map[j] = j; }
    return (ARK_SUCCESS);
  }

  /* ----------------------------------------
   * Compute storage map for MRI-GARK methods
   * ---------------------------------------- */

  /* Number of stage RHS vectors active */
  *nstages_active = 0;

  /* Initial storage index */
  idx = 0;

  /* Check if a stage corresponds to a column of zeros for all coupling
   * matrices by computing the column sums */
  for (j = 0; j < MRIC->stages; j++)
  {
    Wsum = ZERO;
    Gsum = ZERO;

    if (MRIC->W)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        for (i = 0; i <= MRIC->stages; i++)
        {
          Wsum += SUNRabs(MRIC->W[k][i][j]);
        }
      }
    }

    if (MRIC->G)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        for (i = 0; i <= MRIC->stages; i++)
        {
          Gsum += SUNRabs(MRIC->G[k][i][j]);
        }
      }
    }

    if (Wsum > tol || Gsum > tol)
    {
      stage_map[j] = idx;
      idx++;
    }
    else { stage_map[j] = -1; }
  }

  /* Check and set number of stage RHS vectors active */
  if (idx < 1) { return (ARK_ILL_INPUT); }

  *nstages_active = idx;

  return (ARK_SUCCESS);
}